

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O2

wchar_t history_total_bytes(void)

{
  int iVar1;
  size_t sVar2;
  wchar_t wVar3;
  HistEvent ev;
  long lVar4;
  
  iVar1 = history(h,(HistEvent_conflict *)&ev,8);
  if (iVar1 == 0) {
    history(h,(HistEvent_conflict *)&ev,3);
    lVar4 = 0;
    do {
      sVar2 = strlen(ev.str);
      lVar4 = lVar4 + sVar2;
      wVar3 = (wchar_t)lVar4;
      iVar1 = history(h,(HistEvent_conflict *)&ev,6);
    } while (iVar1 == 0);
    history(h,(HistEvent_conflict *)&ev,0x10,(ulong)(uint)ev.num);
  }
  else {
    wVar3 = L'\xffffffff';
  }
  return wVar3;
}

Assistant:

int
history_total_bytes(void)
{
	HistEvent ev;
	int curr_num;
	size_t size;

	if (history(h, &ev, H_CURR) != 0)
		return -1;
	curr_num = ev.num;

	(void)history(h, &ev, H_FIRST);
	size = 0;
	do
		size += strlen(ev.str) * sizeof(*ev.str);
	while (history(h, &ev, H_NEXT) == 0);

	/* get to the same position as before */
	history(h, &ev, H_PREV_EVENT, curr_num);

	return (int)size;
}